

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O3

DiskFileToVirtualFileResult __thiscall
google::protobuf::compiler::DiskSourceTree::DiskFileToVirtualFile
          (DiskSourceTree *this,string *disk_file,string *virtual_file,string *shadowing_disk_file)

{
  string *psVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  ZeroCopyInputStream *pZVar5;
  pointer pMVar6;
  DiskFileToVirtualFileResult DVar7;
  DiskSourceTree *this_00;
  ulong uVar8;
  long lVar9;
  undefined1 local_80 [8];
  string canonical_disk_file;
  string *local_40;
  string *local_38;
  
  pcVar2 = (disk_file->_M_dataplus)._M_p;
  psVar1 = (string *)((long)&canonical_disk_file.field_2 + 8);
  canonical_disk_file.field_2._8_8_ = &stack0xffffffffffffffb0;
  local_40 = shadowing_disk_file;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar1,pcVar2,pcVar2 + disk_file->_M_string_length);
  CanonicalizePath((string *)local_80,psVar1);
  if ((undefined1 *)canonical_disk_file.field_2._8_8_ != &stack0xffffffffffffffb0) {
    operator_delete((void *)canonical_disk_file.field_2._8_8_);
  }
  pMVar6 = (this->mappings_).
           super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
           ._M_impl.super__Vector_impl_data._M_start;
  DVar7 = NO_MAPPING;
  if ((this->mappings_).
      super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
      ._M_impl.super__Vector_impl_data._M_finish != pMVar6) {
    lVar9 = 0;
    uVar8 = 0;
    local_38 = disk_file;
    do {
      this_00 = (DiskSourceTree *)local_80;
      bVar3 = ApplyMapping((string *)local_80,
                           (string *)((long)&(pMVar6->disk_path)._M_dataplus._M_p + lVar9),
                           (string *)((long)&(pMVar6->virtual_path)._M_dataplus._M_p + lVar9),
                           virtual_file);
      psVar1 = local_40;
      if (bVar3) {
        if (uVar8 == 0) goto LAB_0025a651;
        lVar9 = 0x20;
        goto LAB_0025a61b;
      }
      uVar8 = uVar8 + 1;
      pMVar6 = (this->mappings_).
               super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 0x40;
    } while (uVar8 < (ulong)((long)(this->mappings_).
                                   super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar6 >> 6));
    DVar7 = NO_MAPPING;
  }
  goto LAB_0025a686;
LAB_0025a61b:
  do {
    pMVar6 = (this->mappings_).
             super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this_00 = (DiskSourceTree *)virtual_file;
    bVar3 = ApplyMapping(virtual_file,(string *)((long)pMVar6 + lVar9 + -0x20),
                         (string *)((long)&(pMVar6->virtual_path)._M_dataplus._M_p + lVar9),psVar1);
    if (bVar3) {
      this_00 = (DiskSourceTree *)(psVar1->_M_dataplus)._M_p;
      iVar4 = access((char *)this_00,0);
      if (-1 < iVar4) {
        DVar7 = SHADOWED;
        goto LAB_0025a686;
      }
    }
    lVar9 = lVar9 + 0x40;
    uVar8 = uVar8 - 1;
  } while (uVar8 != 0);
LAB_0025a651:
  psVar1->_M_string_length = 0;
  *(psVar1->_M_dataplus)._M_p = '\0';
  pZVar5 = OpenDiskFile(this_00,local_38);
  if (pZVar5 == (ZeroCopyInputStream *)0x0) {
    DVar7 = CANNOT_OPEN;
  }
  else {
    (*pZVar5->_vptr_ZeroCopyInputStream[1])(pZVar5);
    DVar7 = SUCCESS;
  }
LAB_0025a686:
  if (local_80 != (undefined1  [8])&canonical_disk_file._M_string_length) {
    operator_delete((void *)local_80);
  }
  return DVar7;
}

Assistant:

DiskSourceTree::DiskFileToVirtualFileResult
DiskSourceTree::DiskFileToVirtualFile(const std::string& disk_file,
                                      std::string* virtual_file,
                                      std::string* shadowing_disk_file) {
  int mapping_index = -1;
  std::string canonical_disk_file = CanonicalizePath(disk_file);

  for (int i = 0; i < mappings_.size(); i++) {
    // Apply the mapping in reverse.
    if (ApplyMapping(canonical_disk_file, mappings_[i].disk_path,
                     mappings_[i].virtual_path, virtual_file)) {
      // Success.
      mapping_index = i;
      break;
    }
  }

  if (mapping_index == -1) {
    return NO_MAPPING;
  }

  // Iterate through all mappings with higher precedence and verify that none
  // of them map this file to some other existing file.
  for (int i = 0; i < mapping_index; i++) {
    if (ApplyMapping(*virtual_file, mappings_[i].virtual_path,
                     mappings_[i].disk_path, shadowing_disk_file)) {
      if (access(shadowing_disk_file->c_str(), F_OK) >= 0) {
        // File exists.
        return SHADOWED;
      }
    }
  }
  shadowing_disk_file->clear();

  // Verify that we can open the file.  Note that this also has the side-effect
  // of verifying that we are not canonicalizing away any non-existent
  // directories.
  std::unique_ptr<io::ZeroCopyInputStream> stream(OpenDiskFile(disk_file));
  if (stream == NULL) {
    return CANNOT_OPEN;
  }

  return SUCCESS;
}